

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AeronArchive.cpp
# Opt level: O0

void __thiscall aeron::archive::AeronArchive::AeronArchive(AeronArchive *this,Context *ctx)

{
  bool bVar1;
  int32_t iVar2;
  uint uVar3;
  shared_ptr<aeron::Aeron> *psVar4;
  element_type *peVar5;
  string *psVar6;
  __shared_ptr *p_Var7;
  pointer this_00;
  ArchiveException *this_01;
  char *pcVar8;
  int64_t iVar9;
  undefined1 local_118 [16];
  string local_108;
  allocator local_e1;
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  int64_t local_a0;
  int64_t correlationId;
  undefined1 local_90 [8];
  undefined1 local_88 [24];
  shared_ptr<aeron::ExclusivePublication> publication;
  int64_t pubId;
  undefined1 local_58 [24];
  shared_ptr<aeron::Subscription> subscription;
  int64_t subId;
  undefined8 local_18;
  Context *ctx_local;
  AeronArchive *this_local;
  
  local_18 = ctx;
  ctx_local = &this->ctx_;
  Context::Context(&this->ctx_,ctx);
  std::unique_ptr<aeron::archive::ArchiveProxy,std::default_delete<aeron::archive::ArchiveProxy>>::
  unique_ptr<std::default_delete<aeron::archive::ArchiveProxy>,void>
            ((unique_ptr<aeron::archive::ArchiveProxy,std::default_delete<aeron::archive::ArchiveProxy>>
              *)&this->archiveProxy_);
  std::
  unique_ptr<aeron::archive::ControlResponsePoller,std::default_delete<aeron::archive::ControlResponsePoller>>
  ::unique_ptr<std::default_delete<aeron::archive::ControlResponsePoller>,void>
            ((unique_ptr<aeron::archive::ControlResponsePoller,std::default_delete<aeron::archive::ControlResponsePoller>>
              *)&this->controlResponsePoller_);
  std::
  unique_ptr<aeron::archive::RecordingDescriptorPoller,std::default_delete<aeron::archive::RecordingDescriptorPoller>>
  ::unique_ptr<std::default_delete<aeron::archive::RecordingDescriptorPoller>,void>
            ((unique_ptr<aeron::archive::RecordingDescriptorPoller,std::default_delete<aeron::archive::RecordingDescriptorPoller>>
              *)&this->recordingDescriptorPoller_);
  std::shared_ptr<aeron::Aeron>::shared_ptr(&this->aeron_);
  concurrent::YieldingIdleStrategy::YieldingIdleStrategy((YieldingIdleStrategy *)&this->field_0x138)
  ;
  std::mutex::mutex(&this->lock_);
  subId = Context::messageTimeoutNs(&this->ctx_);
  std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<long,void>
            ((duration<long,std::ratio<1l,1000000000l>> *)&this->messageTimeoutNs_,&subId);
  Context::conclude(&this->ctx_);
  psVar4 = Context::aeron(&this->ctx_);
  std::shared_ptr<aeron::Aeron>::operator=(&this->aeron_,psVar4);
  peVar5 = std::__shared_ptr_access<aeron::Aeron,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<aeron::Aeron,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )&this->aeron_);
  psVar6 = Context::controlResponseChannel_abi_cxx11_(&this->ctx_);
  iVar2 = Context::controlResponseStreamId(&this->ctx_);
  subscription.super___shared_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)Aeron::addSubscription(peVar5,psVar6,iVar2)
  ;
  std::shared_ptr<aeron::Subscription>::shared_ptr
            ((shared_ptr<aeron::Subscription> *)(local_58 + 0x10));
  while( true ) {
    peVar5 = std::__shared_ptr_access<aeron::Aeron,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<aeron::Aeron,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->aeron_);
    Aeron::findSubscription((Aeron *)local_58,(int64_t)peVar5);
    p_Var7 = (__shared_ptr *)
             std::shared_ptr<aeron::Subscription>::operator=
                       ((shared_ptr<aeron::Subscription> *)(local_58 + 0x10),
                        (shared_ptr<aeron::Subscription> *)local_58);
    bVar1 = std::__shared_ptr::operator_cast_to_bool(p_Var7);
    std::shared_ptr<aeron::Subscription>::~shared_ptr((shared_ptr<aeron::Subscription> *)local_58);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    std::this_thread::yield();
  }
  std::
  make_unique<aeron::archive::ControlResponsePoller,std::shared_ptr<aeron::Subscription>&,int_const&>
            ((shared_ptr<aeron::Subscription> *)&pubId,(int *)(local_58 + 0x10));
  std::
  unique_ptr<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
  ::operator=(&this->controlResponsePoller_,
              (unique_ptr<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
               *)&pubId);
  std::
  unique_ptr<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
  ::~unique_ptr((unique_ptr<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                 *)&pubId);
  peVar5 = std::__shared_ptr_access<aeron::Aeron,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<aeron::Aeron,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )&this->aeron_);
  psVar6 = Context::controlRequestChannel_abi_cxx11_(&this->ctx_);
  iVar2 = Context::controlRequestStreamId(&this->ctx_);
  publication.super___shared_ptr<aeron::ExclusivePublication,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       Aeron::addExclusivePublication(peVar5,psVar6,iVar2);
  std::shared_ptr<aeron::ExclusivePublication>::shared_ptr
            ((shared_ptr<aeron::ExclusivePublication> *)(local_88 + 0x10));
  while( true ) {
    peVar5 = std::__shared_ptr_access<aeron::Aeron,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<aeron::Aeron,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->aeron_);
    Aeron::findExclusivePublication((Aeron *)local_88,(int64_t)peVar5);
    p_Var7 = (__shared_ptr *)
             std::shared_ptr<aeron::ExclusivePublication>::operator=
                       ((shared_ptr<aeron::ExclusivePublication> *)(local_88 + 0x10),
                        (shared_ptr<aeron::ExclusivePublication> *)local_88);
    bVar1 = std::__shared_ptr::operator_cast_to_bool(p_Var7);
    std::shared_ptr<aeron::ExclusivePublication>::~shared_ptr
              ((shared_ptr<aeron::ExclusivePublication> *)local_88);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    std::this_thread::yield();
  }
  correlationId = Context::messageTimeoutNs(&this->ctx_);
  std::
  make_unique<aeron::archive::ArchiveProxy,std::shared_ptr<aeron::ExclusivePublication>&,long,int_const&>
            ((shared_ptr<aeron::ExclusivePublication> *)local_90,(long *)(local_88 + 0x10),
             (int *)&correlationId);
  std::unique_ptr<aeron::archive::ArchiveProxy,_std::default_delete<aeron::archive::ArchiveProxy>_>
  ::operator=(&this->archiveProxy_,
              (unique_ptr<aeron::archive::ArchiveProxy,_std::default_delete<aeron::archive::ArchiveProxy>_>
               *)local_90);
  std::unique_ptr<aeron::archive::ArchiveProxy,_std::default_delete<aeron::archive::ArchiveProxy>_>
  ::~unique_ptr((unique_ptr<aeron::archive::ArchiveProxy,_std::default_delete<aeron::archive::ArchiveProxy>_>
                 *)local_90);
  peVar5 = std::__shared_ptr_access<aeron::Aeron,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<aeron::Aeron,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )&this->aeron_);
  local_a0 = Aeron::nextCorrelationId(peVar5);
  this_00 = std::
            unique_ptr<aeron::archive::ArchiveProxy,_std::default_delete<aeron::archive::ArchiveProxy>_>
            ::operator->(&this->archiveProxy_);
  psVar6 = Context::controlResponseChannel_abi_cxx11_(&this->ctx_);
  uVar3 = Context::controlResponseStreamId(&this->ctx_);
  iVar9 = local_a0;
  peVar5 = std::__shared_ptr_access<aeron::Aeron,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<aeron::Aeron,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )&this->aeron_);
  Aeron::conductorAgentInvoker(peVar5);
  uVar3 = ArchiveProxy::connect(this_00,(int)psVar6,(sockaddr *)(ulong)uVar3,(socklen_t)iVar9);
  if ((uVar3 & 1) == 0) {
    local_118[0xe] = 1;
    this_01 = (ArchiveException *)__cxa_allocate_exception(0x48);
    psVar6 = Context::controlResponseChannel_abi_cxx11_(&this->ctx_);
    std::operator+(&local_c0,"cannot connect to archive: ",psVar6);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_e0,"aeron::archive::AeronArchive::AeronArchive(const Context &)",
               &local_e1);
    pcVar8 = aeron::util::past_prefix
                       ("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/AeronArchive.cpp"
                       );
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_108,pcVar8,(allocator *)(local_118 + 0xf));
    ArchiveException::ArchiveException(this_01,&local_c0,&local_e0,&local_108,0x40);
    local_118[0xe] = 0;
    __cxa_throw(this_01,&ArchiveException::typeinfo,ArchiveException::~ArchiveException);
  }
  iVar9 = awaitSessionOpened(this,local_a0);
  this->controlSessionId_ = iVar9;
  std::
  make_unique<aeron::archive::RecordingDescriptorPoller,std::shared_ptr<aeron::Subscription>&,int_const&,long&>
            ((shared_ptr<aeron::Subscription> *)local_118,(int *)(local_58 + 0x10),
             (long *)&(anonymous_namespace)::FRAGMENT_LIMIT);
  std::
  unique_ptr<aeron::archive::RecordingDescriptorPoller,_std::default_delete<aeron::archive::RecordingDescriptorPoller>_>
  ::operator=(&this->recordingDescriptorPoller_,
              (unique_ptr<aeron::archive::RecordingDescriptorPoller,_std::default_delete<aeron::archive::RecordingDescriptorPoller>_>
               *)local_118);
  std::
  unique_ptr<aeron::archive::RecordingDescriptorPoller,_std::default_delete<aeron::archive::RecordingDescriptorPoller>_>
  ::~unique_ptr((unique_ptr<aeron::archive::RecordingDescriptorPoller,_std::default_delete<aeron::archive::RecordingDescriptorPoller>_>
                 *)local_118);
  std::shared_ptr<aeron::ExclusivePublication>::~shared_ptr
            ((shared_ptr<aeron::ExclusivePublication> *)(local_88 + 0x10));
  std::shared_ptr<aeron::Subscription>::~shared_ptr
            ((shared_ptr<aeron::Subscription> *)(local_58 + 0x10));
  return;
}

Assistant:

AeronArchive::AeronArchive(const Context& ctx)
    : ctx_(ctx)
    , messageTimeoutNs_(ctx_.messageTimeoutNs()) {
    ctx_.conclude();

    aeron_ = ctx_.aeron();
    // aeronClientInvoker_ = aeron_->conductorAgentInvoker();
    // TODO: get it from the context: idleStrategy_ = ...

    std::int64_t subId = aeron_->addSubscription(ctx_.controlResponseChannel(), ctx_.controlResponseStreamId());
    std::shared_ptr<Subscription> subscription;
    while (!(subscription = aeron_->findSubscription(subId))) {
        std::this_thread::yield();
    }

    controlResponsePoller_ = std::make_unique<ControlResponsePoller>(subscription, FRAGMENT_LIMIT);

    std::int64_t pubId = aeron_->addExclusivePublication(ctx_.controlRequestChannel(), ctx_.controlRequestStreamId());
    std::shared_ptr<ExclusivePublication> publication;
    while (!(publication = aeron_->findExclusivePublication(pubId))) {
        std::this_thread::yield();
    }

    archiveProxy_ = std::make_unique<ArchiveProxy>(publication, ctx_.messageTimeoutNs(), DEFAULT_RETRY_ATTEMPTS);

    std::int64_t correlationId = aeron_->nextCorrelationId();
    if (!archiveProxy_->connect(ctx_.controlResponseChannel(), ctx_.controlResponseStreamId(), correlationId,
                                aeron_->conductorAgentInvoker())) {
        throw ArchiveException("cannot connect to archive: " + ctx_.controlResponseChannel(), SOURCEINFO);
    }

    controlSessionId_ = awaitSessionOpened(correlationId);
    recordingDescriptorPoller_ =
        std::make_unique<RecordingDescriptorPoller>(subscription, FRAGMENT_LIMIT, controlSessionId_);
}